

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int type_set_format(coda_type *type,coda_format format)

{
  coda_type_class cVar1;
  long local_28;
  long i;
  long num_record_fields;
  coda_type *pcStack_10;
  coda_format format_local;
  coda_type *type_local;
  
  type->format = format;
  cVar1 = type->type_class;
  num_record_fields._4_4_ = format;
  pcStack_10 = type;
  if (cVar1 == coda_record_class) {
    coda_type_get_num_record_fields(type,&i);
    for (local_28 = 0; local_28 < i; local_28 = local_28 + 1) {
      type_set_format(*(coda_type **)(*(long *)(pcStack_10[1].description + local_28 * 8) + 0x10),
                      num_record_fields._4_4_);
    }
  }
  else if (cVar1 == coda_array_class) {
    type_set_format(*(coda_type **)(type + 1),format);
  }
  else if (cVar1 == coda_special_class) {
    type_set_format(*(coda_type **)&type[1].type_class,format);
  }
  if (pcStack_10->attributes != (coda_type_record *)0x0) {
    type_set_format((coda_type *)pcStack_10->attributes,num_record_fields._4_4_);
  }
  return 0;
}

Assistant:

static int type_set_format(coda_type *type, coda_format format)
{
    type->format = format;
    switch (type->type_class)
    {
        case coda_record_class:
            {
                long num_record_fields;
                long i;

                coda_type_get_num_record_fields(type, &num_record_fields);
                for (i = 0; i < num_record_fields; i++)
                {
                    type_set_format(((coda_type_record *)type)->field[i]->type, format);
                }
            }
            break;
        case coda_array_class:
            type_set_format(((coda_type_array *)type)->base_type, format);
            break;
        case coda_special_class:
            type_set_format(((coda_type_special *)type)->base_type, format);
            break;
        default:
            break;
    }
    if (type->attributes != NULL)
    {
        type_set_format((coda_type *)type->attributes, format);
    }

    return 0;
}